

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stubs.h
# Opt level: O0

uint64_t getms(void)

{
  undefined1 local_20 [8];
  timeval tv;
  
  if (getms::epoch == 0) {
    getms::epoch = time((time_t *)0x0);
  }
  gettimeofday((timeval *)local_20,(__timezone_ptr_t)0x0);
  if ((long)local_20 < getms::epoch) {
    tv.tv_usec = 0;
  }
  else {
    tv.tv_usec = ((long)local_20 - getms::epoch) * 1000 + tv.tv_sec / 1000;
  }
  return tv.tv_usec;
}

Assistant:

uint64_t
getms(void)
{
#ifdef _WIN32
	return (GetTickCount64());
#else
	static time_t  epoch;
	struct timeval tv;

	if (epoch == 0) {
		epoch = time(NULL);
	}
	gettimeofday(&tv, NULL);

	if (tv.tv_sec < epoch) {
		// Broken clock.
		// This will force all other timing tests to fail
		return (0);
	}
	tv.tv_sec -= epoch;
	return (
	    ((uint64_t)(tv.tv_sec) * 1000) + (uint64_t)(tv.tv_usec / 1000));
#endif
}